

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginVST2.cpp
# Opt level: O0

void __thiscall
DISTRHO::ParameterAndNotesHelper::~ParameterAndNotesHelper(ParameterAndNotesHelper *this)

{
  ParameterAndNotesHelper *this_local;
  
  this->_vptr_ParameterAndNotesHelper = (_func_int **)&PTR__ParameterAndNotesHelper_0011dca8;
  if (this->parameterValues != (float *)0x0) {
    if (this->parameterValues != (float *)0x0) {
      operator_delete__(this->parameterValues);
    }
    this->parameterValues = (float *)0x0;
  }
  return;
}

Assistant:

virtual ~ParameterAndNotesHelper()
    {
        if (parameterValues != nullptr)
        {
            delete[] parameterValues;
            parameterValues = nullptr;
        }
#if DISTRHO_PLUGIN_HAS_UI
        if (parameterChecks != nullptr)
        {
            delete[] parameterChecks;
            parameterChecks = nullptr;
        }
#endif
    }